

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O1

void __thiscall cplus::lang::ByteArray::freeMemory(ByteArray *this)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  
  uVar1 = this->size;
  if (uVar1 != this->bufferSize) {
    pcVar3 = (char *)operator_new__(uVar1);
    if (uVar1 != 0) {
      pcVar2 = this->buffer;
      uVar4 = 0;
      do {
        pcVar3[uVar4] = pcVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    if (this->buffer != (char *)0x0) {
      operator_delete__(this->buffer);
    }
    this->buffer = pcVar3;
    this->bufferSize = this->size;
  }
  return;
}

Assistant:

void ByteArray::freeMemory() {
			if (size != bufferSize) {
				auto newBuffer = new char[size];
				for (size_t index = 0; index < size; index++) {
					newBuffer[index] = buffer[index];
				}
				delete[] buffer;
				buffer = newBuffer;
				bufferSize = size;
			}
		}